

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printJsonResult(Statement *query,ostream *stream,bool isFirstRow)

{
  int32_t iVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined7 in_register_00000011;
  double dVar4;
  Column local_c0;
  Column local_a8;
  Column local_90;
  Column local_78;
  Column local_60;
  Column local_48;
  Column local_30;
  
  if ((int)CONCAT71(in_register_00000011,isFirstRow) == 0) {
    poVar2 = std::operator<<(stream,",");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<(stream,"{\"timestamp\":\"");
  SQLite::Statement::getColumn(&local_30,query,0);
  pcVar3 = SQLite::Column::getText(&local_30,"");
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\",");
  std::operator<<(poVar2,"\"temp1\":");
  SQLite::Statement::getColumn(&local_48,query,1);
  dVar4 = SQLite::Column::getDouble(&local_48);
  poVar2 = std::ostream::_M_insert<double>(dVar4);
  poVar2 = std::operator<<(poVar2,",");
  std::operator<<(poVar2,"\"temp2\":");
  SQLite::Statement::getColumn(&local_60,query,2);
  dVar4 = SQLite::Column::getDouble(&local_60);
  poVar2 = std::ostream::_M_insert<double>(dVar4);
  poVar2 = std::operator<<(poVar2,",");
  std::operator<<(poVar2,"\"temp3\":");
  SQLite::Statement::getColumn(&local_78,query,3);
  dVar4 = SQLite::Column::getDouble(&local_78);
  poVar2 = std::ostream::_M_insert<double>(dVar4);
  poVar2 = std::operator<<(poVar2,",");
  std::operator<<(poVar2,"\"temp4\":");
  SQLite::Statement::getColumn(&local_90,query,4);
  dVar4 = SQLite::Column::getDouble(&local_90);
  poVar2 = std::ostream::_M_insert<double>(dVar4);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"\"valve1\":");
  SQLite::Statement::getColumn(&local_a8,query,5);
  iVar1 = SQLite::Column::getInt(&local_a8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"\"valve2\":");
  SQLite::Statement::getColumn(&local_c0,query,6);
  iVar1 = SQLite::Column::getInt(&local_c0);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::operator<<(poVar2,"}");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void printJsonResult(SQLite::Statement& query, std::ostream& stream, bool isFirstRow)
{
    if (!isFirstRow) {
        stream << "," << std::endl;
    }

    stream << "{\"timestamp\":\"" << query.getColumn(0).getText()   << "\","
           << "\"temp1\":"        << query.getColumn(1).getDouble() << ","
           << "\"temp2\":"        << query.getColumn(2).getDouble() << ","
           << "\"temp3\":"        << query.getColumn(3).getDouble() << ","
           << "\"temp4\":"        << query.getColumn(4).getDouble() << ","
           << "\"valve1\":"       << query.getColumn(5).getInt()    << ","
           << "\"valve2\":"       << query.getColumn(6).getInt()    << "}";
}